

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_pshufw_mmx_x86_64(MMXReg *d,MMXReg *s,int order)

{
  MMXReg MVar1;
  MMXReg r;
  int order_local;
  MMXReg *s_local;
  MMXReg *d_local;
  
  MVar1._w_MMXReg[1] = s->_w_MMXReg[(int)(order >> 2 & 3)];
  MVar1._w_MMXReg[0] = s->_w_MMXReg[(int)(order & 3)];
  MVar1._w_MMXReg[2] = s->_w_MMXReg[(int)(order >> 4 & 3)];
  MVar1._w_MMXReg[3] = s->_w_MMXReg[(int)(order >> 6 & 3)];
  *d = MVar1;
  return;
}

Assistant:

void glue(helper_pshufw, SUFFIX)(Reg *d, Reg *s, int order)
{
    Reg r;

    r.W(0) = s->W(order & 3);
    r.W(1) = s->W((order >> 2) & 3);
    r.W(2) = s->W((order >> 4) & 3);
    r.W(3) = s->W((order >> 6) & 3);
    *d = r;
}